

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O1

void my_numbox_draw_update(t_gobj *client,_glist *glist)

{
  char *__s;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  _glist *p_Var3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  char tag [128];
  
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    p_Var3 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar1));
    sprintf(tag,"%lxNUMBER",client);
    if (((ulong)client[0x44].g_pd & 0x8000000) == 0) {
      my_numbox_ftoa((t_my_numbox *)client);
      uVar5 = 0xff;
      if (((ulong)client[0x44].g_pd & 0x1000000) == 0) {
        uVar5 = (ulong)*(uint *)((long)&client[0x44].g_next + 4);
      }
    }
    else {
      __s = (char *)((long)&client[0x4c].g_pd + 4);
      if (*(char *)((long)&client[0x4c].g_pd + 4) != '\0') {
        sVar4 = strlen(__s);
        iVar2 = (int)sVar4;
        *(undefined1 *)((long)&client[0x4c].g_pd + (long)iVar2 + 4) = 0x3e;
        *(undefined1 *)((long)&client[0x4c].g_pd + (long)(iVar2 + 1) + 4) = 0;
        iVar1 = *(int *)((long)&client[0x4e].g_pd + 4);
        pcVar6 = (char *)((long)&client[0x4c].g_pd + (long)(iVar2 - iVar1) + 5);
        if (iVar2 < iVar1) {
          pcVar6 = __s;
        }
        pdgui_vmess((char *)0x0,"crs rk rs",p_Var3,"itemconfigure",tag,"-fill",0xff0000,"-text",
                    pcVar6);
        *(undefined1 *)((long)&client[0x4c].g_pd + (long)iVar2 + 4) = 0;
        return;
      }
      my_numbox_ftoa((t_my_numbox *)client);
      uVar5 = 0xff0000;
    }
    pdgui_vmess((char *)0x0,"crs rk rs",p_Var3,"itemconfigure",tag,"-fill",uVar5,"-text",
                (undefined1 *)((long)&client[0x4c].g_pd + 4));
    *(undefined1 *)((long)&client[0x4c].g_pd + 4) = 0;
  }
  return;
}

Assistant:

static void my_numbox_draw_update(t_gobj *client, t_glist *glist)
{
    t_my_numbox *x = (t_my_numbox *)client;
    if(glist_isvisible(glist))
    {
        t_canvas *canvas = glist_getcanvas(glist);
        char tag[128];
        sprintf(tag, "%lxNUMBER", x);
        if(x->x_gui.x_fsf.x_change)
        {
            if(x->x_buf[0])
            {
                char *cp = x->x_buf;
                int sl = (int)strlen(x->x_buf);

                x->x_buf[sl] = '>';
                x->x_buf[sl+1] = 0;
                if(sl >= x->x_numwidth)
                    cp += sl - x->x_numwidth + 1;
                pdgui_vmess(0, "crs rk rs", canvas, "itemconfigure", tag,
                    "-fill", IEM_GUI_COLOR_EDITED, "-text", cp);
                x->x_buf[sl] = 0;
            }
            else
            {
                my_numbox_ftoa(x);
                pdgui_vmess(0, "crs rk rs", canvas, "itemconfigure", tag,
                    "-fill", IEM_GUI_COLOR_EDITED, "-text", x->x_buf);
                x->x_buf[0] = 0;
            }
        }
        else
        {
            my_numbox_ftoa(x);
                pdgui_vmess(0, "crs rk rs", canvas, "itemconfigure", tag,
                    "-fill", (x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_fcol),
                    "-text", x->x_buf);
            x->x_buf[0] = 0;
        }
    }
}